

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::clearBadBasisChange(HEkk *this,BadBasisChangeReason reason)

{
  pointer pHVar1;
  double dVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  HighsInt HVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  pointer pHVar9;
  pointer pHVar10;
  long lVar11;
  
  pHVar9 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (reason == kAll) {
    if (pHVar1 == pHVar9) {
      return;
    }
    goto LAB_00340041;
  }
  lVar11 = (long)pHVar1 - (long)pHVar9 >> 7;
  pHVar10 = pHVar9;
  if (0 < lVar11) {
    pHVar10 = (pointer)(&pHVar9->taboo + ((long)pHVar1 - (long)pHVar9 & 0xffffffffffffff80));
    lVar11 = lVar11 + 1;
    pHVar9 = pHVar9 + 2;
    do {
      if (pHVar9[-2].reason == reason) {
        pHVar9 = pHVar9 + -2;
        goto LAB_0033ffe6;
      }
      if (pHVar9[-1].reason == reason) {
        pHVar9 = pHVar9 + -1;
        goto LAB_0033ffe6;
      }
      if (pHVar9->reason == reason) goto LAB_0033ffe6;
      if (pHVar9[1].reason == reason) {
        pHVar9 = pHVar9 + 1;
        goto LAB_0033ffe6;
      }
      lVar11 = lVar11 + -1;
      pHVar9 = pHVar9 + 4;
    } while (1 < lVar11);
  }
  lVar11 = (long)pHVar1 - (long)pHVar10 >> 5;
  if (lVar11 == 1) {
LAB_0033ffc4:
    pHVar9 = pHVar10;
    if (pHVar10->reason != reason) {
      pHVar9 = pHVar1;
    }
  }
  else if (lVar11 == 2) {
LAB_0033ffbb:
    pHVar9 = pHVar10;
    if (pHVar10->reason != reason) {
      pHVar10 = pHVar10 + 1;
      goto LAB_0033ffc4;
    }
  }
  else {
    pHVar9 = pHVar1;
    if ((lVar11 == 3) && (pHVar9 = pHVar10, pHVar10->reason != reason)) {
      pHVar10 = pHVar10 + 1;
      goto LAB_0033ffbb;
    }
  }
LAB_0033ffe6:
  pHVar10 = pHVar9 + 1;
  if (pHVar10 != pHVar1 && pHVar9 != pHVar1) {
    do {
      if (pHVar10->reason != reason) {
        bVar4 = pHVar10->taboo;
        uVar5 = *(undefined3 *)&pHVar10->field_0x1;
        HVar6 = pHVar10->row_out;
        HVar7 = pHVar10->variable_out;
        HVar8 = pHVar10->variable_in;
        uVar3 = *(undefined4 *)&pHVar10->field_0x14;
        dVar2 = pHVar10->save_value;
        pHVar9->reason = pHVar10->reason;
        *(undefined4 *)&pHVar9->field_0x14 = uVar3;
        pHVar9->save_value = dVar2;
        pHVar9->taboo = bVar4;
        *(undefined3 *)&pHVar9->field_0x1 = uVar5;
        pHVar9->row_out = HVar6;
        pHVar9->variable_out = HVar7;
        pHVar9->variable_in = HVar8;
        pHVar9 = pHVar9 + 1;
      }
      pHVar10 = pHVar10 + 1;
    } while (pHVar10 != pHVar1);
  }
  pHVar1 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pHVar9 == pHVar1) ||
     (pHVar10 = (this->bad_basis_change_).
                super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     pHVar9 = (pointer)((long)pHVar9 + ((long)pHVar10 - (long)pHVar1)), pHVar10 == pHVar9)) {
    return;
  }
LAB_00340041:
  (this->bad_basis_change_).
  super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = pHVar9;
  return;
}

Assistant:

void HEkk::clearBadBasisChange(const BadBasisChangeReason reason) {
  if (reason == BadBasisChangeReason::kAll) {
    bad_basis_change_.clear();
  } else {
    bad_basis_change_.erase(
        std::remove_if(
            bad_basis_change_.begin(), bad_basis_change_.end(),
            [reason](const HighsSimplexBadBasisChangeRecord& record) {
              return record.reason == reason;
            }),
        bad_basis_change_.end());
  }
}